

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O0

void __thiscall geometrycentral::surface::SurfaceMesh::compressEdges(SurfaceMesh *this)

{
  bool bVar1;
  reference pvVar2;
  SurfaceMesh *in_RDI;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *f;
  iterator __end2;
  iterator __begin2;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *__range2;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> oldIndMap;
  vector<unsigned_long,_std::allocator<unsigned_long>_> newIndMap;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *in_stack_ffffffffffffff38;
  function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>
  *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *arr;
  SurfaceMesh *this_00;
  _Self local_88;
  _Self local_80;
  list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  *local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff98;
  ulong local_58;
  undefined1 local_39 [25];
  allocator_type local_20 [32];
  
  bVar1 = usesImplicitTwin(in_RDI);
  if (!bVar1) {
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2403d9);
    arr = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI->nEdgesFillCount;
    this_00 = (SurfaceMesh *)local_39;
    ::std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x2403fc);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(size_type)arr,
               (value_type_conflict *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
    ::std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x240429);
    for (local_58 = 0; local_58 < in_RDI->nEdgesFillCount; local_58 = local_58 + 1) {
      in_stack_ffffffffffffff57 =
           edgeIsDead((SurfaceMesh *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                      (size_t)in_stack_ffffffffffffff48);
      if (!(bool)in_stack_ffffffffffffff57) {
        in_stack_ffffffffffffff48 = local_20;
        in_stack_ffffffffffffff40 =
             (function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)> *)
             ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_ffffffffffffff48);
        pvVar2 = ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_39 + 1),
                            local_58);
        *pvVar2 = (value_type)in_stack_ffffffffffffff40;
        ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                   (value_type_conflict *)in_stack_ffffffffffffff48);
      }
    }
    applyPermutation<unsigned_long,std::allocator<unsigned_long>,std::allocator<unsigned_long>>
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff48);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    updateValues(this_00,arr,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    in_RDI->nEdgesFillCount = in_RDI->nEdgesCount;
    in_RDI->nEdgesCapacityCount = in_RDI->nEdgesCount;
    local_78 = &in_RDI->edgePermuteCallbackList;
    local_80._M_node =
         (_List_node_base *)
         ::std::__cxx11::
         list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
         ::begin(in_stack_ffffffffffffff38);
    local_88._M_node =
         (_List_node_base *)
         ::std::__cxx11::
         list<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
         ::end(in_stack_ffffffffffffff38);
    while (bVar1 = ::std::operator!=(&local_80,&local_88), bVar1) {
      ::std::
      _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
      ::operator*((_List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
                   *)0x2405d0);
      ::std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>::
      operator()(in_stack_ffffffffffffff40,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_ffffffffffffff38)
      ;
      ::std::
      _List_iterator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>
      ::operator++(&local_80);
    }
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  }
  return;
}

Assistant:

void SurfaceMesh::compressEdges() {

  if (usesImplicitTwin()) {
    // In the implicit-twin case, all updates are handled in the halfedge function (see note there)
    return;
  }

  // Build the compressing shift
  std::vector<size_t> newIndMap;                               // maps new ind -> old ind
  std::vector<size_t> oldIndMap(nEdgesFillCount, INVALID_IND); // maps old ind -> new ind
  for (size_t i = 0; i < nEdgesFillCount; i++) {
    if (!edgeIsDead(i)) {
      oldIndMap[i] = newIndMap.size();
      newIndMap.push_back(i);
    }
  }

  // Permute & resize all per-edge arrays
  eHalfedgeArr = applyPermutation(eHalfedgeArr, newIndMap);

  // Update indices in all edge-valued arrays
  updateValues(heEdgeArr, oldIndMap);

  // Update counts
  nEdgesFillCount = nEdgesCount;
  nEdgesCapacityCount = nEdgesCount;

  // Invoke callbacks
  for (auto& f : edgePermuteCallbackList) {
    f(newIndMap);
  }
}